

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMLSParserImpl::setParameter(DOMLSParserImpl *this,XMLCh *name,void *value)

{
  int iVar1;
  XMLScanner *pXVar2;
  DOMException *this_00;
  MemoryManager *memoryManager;
  void *value_local;
  XMLCh *name_local;
  DOMLSParserImpl *this_local;
  
  iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMResourceResolver);
  if (iVar1 == 0) {
    this->fEntityResolver = (DOMLSResourceResolver *)value;
    if (this->fEntityResolver == (DOMLSResourceResolver *)0x0) {
      pXVar2 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
      XMLScanner::setEntityHandler(pXVar2,(XMLEntityHandler *)0x0);
    }
    else {
      pXVar2 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
      XMLScanner::setEntityHandler(pXVar2,&(this->super_AbstractDOMParser).super_XMLEntityHandler);
      this->fXMLEntityResolver = (XMLEntityResolver *)0x0;
    }
  }
  else {
    iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMErrorHandler);
    if (iVar1 == 0) {
      this->fErrorHandler = (DOMErrorHandler *)value;
      if (this->fErrorHandler == (DOMErrorHandler *)0x0) {
        pXVar2 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
        XMLScanner::setErrorReporter(pXVar2,(XMLErrorReporter *)0x0);
      }
      else {
        pXVar2 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
        XMLScanner::setErrorReporter(pXVar2,&(this->super_AbstractDOMParser).super_XMLErrorReporter)
        ;
      }
    }
    else {
      iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSchemaLocation);
      if ((iVar1 != 0) &&
         (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSchemaType), iVar1 != 0)
         ) {
        iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesEntityResolver);
        if (iVar1 == 0) {
          this->fXMLEntityResolver = (XMLEntityResolver *)value;
          if (this->fXMLEntityResolver == (XMLEntityResolver *)0x0) {
            pXVar2 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
            XMLScanner::setEntityHandler(pXVar2,(XMLEntityHandler *)0x0);
          }
          else {
            pXVar2 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
            XMLScanner::setEntityHandler
                      (pXVar2,&(this->super_AbstractDOMParser).super_XMLEntityHandler);
            this->fEntityResolver = (DOMLSResourceResolver *)0x0;
          }
        }
        else {
          iVar1 = XMLString::compareIStringASCII
                            (name,(XMLCh *)XMLUni::fgXercesSchemaExternalSchemaLocation);
          if (iVar1 == 0) {
            AbstractDOMParser::setExternalSchemaLocation
                      (&this->super_AbstractDOMParser,(XMLCh *)value);
          }
          else {
            iVar1 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation
                              );
            if (iVar1 == 0) {
              AbstractDOMParser::setExternalNoNamespaceSchemaLocation
                        (&this->super_AbstractDOMParser,(XMLCh *)value);
            }
            else {
              iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesSecurityManager);
              if (iVar1 == 0) {
                AbstractDOMParser::setSecurityManager
                          (&this->super_AbstractDOMParser,(SecurityManager *)value);
              }
              else {
                iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesScannerName);
                if (iVar1 == 0) {
                  AbstractDOMParser::useScanner(&this->super_AbstractDOMParser,(XMLCh *)value);
                }
                else {
                  iVar1 = XMLString::compareIStringASCII
                                    (name,(XMLCh *)XMLUni::
                                                  fgXercesParserUseDocumentFromImplementation);
                  if (iVar1 == 0) {
                    AbstractDOMParser::useImplementation
                              (&this->super_AbstractDOMParser,(XMLCh *)value);
                  }
                  else {
                    iVar1 = XMLString::compareIStringASCII
                                      (name,(XMLCh *)XMLUni::fgXercesLowWaterMark);
                    if (iVar1 != 0) {
                      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
                      memoryManager =
                           AbstractDOMParser::getMemoryManager(&this->super_AbstractDOMParser);
                      DOMException::DOMException(this_00,8,0,memoryManager);
                      __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
                    }
                    AbstractDOMParser::setLowWaterMark(&this->super_AbstractDOMParser,*value);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void DOMLSParserImpl::setParameter(const XMLCh* name, const void* value)
{
    if (XMLString::compareIStringASCII(name, XMLUni::fgDOMResourceResolver) == 0)
    {
        fEntityResolver = (DOMLSResourceResolver*)value;
        if (fEntityResolver) {
            getScanner()->setEntityHandler(this);
            fXMLEntityResolver = 0;
        }
        else {
            getScanner()->setEntityHandler(0);
        }
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMErrorHandler) == 0)
    {
        fErrorHandler = (DOMErrorHandler*)value;
        if (fErrorHandler) {
            getScanner()->setErrorReporter(this);
        }
        else {
            getScanner()->setErrorReporter(0);
        }
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMSchemaLocation) == 0)
    {
        // TODO
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMSchemaType) == 0)
    {
        // TODO
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesEntityResolver) == 0)
    {
        fXMLEntityResolver = (XMLEntityResolver*)value;
        if (fXMLEntityResolver) {
            getScanner()->setEntityHandler(this);
            fEntityResolver = 0;
        }
        else {
          getScanner()->setEntityHandler(0);
        }
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaExternalSchemaLocation) == 0)
    {
      setExternalSchemaLocation((XMLCh*)value);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation) == 0)
    {
      setExternalNoNamespaceSchemaLocation((XMLCh*)value);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSecurityManager) == 0)
    {
      setSecurityManager((SecurityManager*)value);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesScannerName) == 0)
    {
        AbstractDOMParser::useScanner((const XMLCh*) value);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesParserUseDocumentFromImplementation) == 0)
    {
        useImplementation((const XMLCh*) value);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesLowWaterMark) == 0)
    {
        setLowWaterMark(*(const XMLSize_t*)value);
    }
    else
        throw DOMException(DOMException::NOT_FOUND_ERR, 0, getMemoryManager());
}